

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

string * __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ProcessFromenvLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *flagval,
          FlagSettingMode set_mode,bool errors_are_fatal)

{
  size_type sVar1;
  char *name;
  int iVar2;
  CommandLineFlag *flag;
  undefined8 *puVar3;
  char *__s;
  long *plVar4;
  mapped_type *pmVar5;
  size_type *psVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  undefined7 in_register_00000081;
  ulong uVar11;
  long lVar12;
  string envname;
  string envval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flaglist;
  string local_140;
  string local_120;
  allocator<char> local_f9;
  key_type local_f8;
  key_type local_d8;
  string *local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_b0;
  CommandLineFlagParser *local_a8;
  FlagSettingMode local_a0;
  undefined4 local_9c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  key_type local_50;
  
  local_9c = (undefined4)CONCAT71(in_register_00000081,errors_are_fatal);
  local_60 = &__return_storage_ptr__->field_2;
  sVar1 = flagval->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  local_b8 = __return_storage_ptr__;
  local_a8 = this;
  local_a0 = set_mode;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ParseFlagList((flagval->_M_dataplus)._M_p,&local_78);
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_b0 = &local_a8->error_flags_;
      local_58 = &local_a8->undefined_names_;
      lVar12 = 0;
      uVar11 = 0;
      do {
        name = *(char **)((long)&((local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar12);
        flag = FlagRegistry::FindFlagLocked(local_a8->registry_,name);
        if (flag == (CommandLineFlag *)0x0) {
          StringPrintf_abi_cxx11_
                    (&local_120,
                     "%sunknown command line flag \'%s\' (via --fromenv or --tryfromenv)\n",
                     "ERROR: ",name);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,name,(allocator<char> *)&local_140);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_b0,&local_f8);
          std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,name,(allocator<char> *)&local_f8);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](local_58,&local_120);
          std::__cxx11::string::_M_replace
                    ((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x129378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"FLAGS_","");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,name,(allocator<char> *)&local_d8);
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            uVar8 = CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]);
          }
          if (uVar8 < local_140._M_string_length + local_f8._M_string_length) {
            uVar9 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              uVar9 = local_140.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < local_140._M_string_length + local_f8._M_string_length)
            goto LAB_0011fdb8;
            puVar3 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_140,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
          }
          else {
LAB_0011fdb8:
            puVar3 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)local_140._M_dataplus._M_p);
          }
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          psVar6 = puVar3 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_120.field_2._M_allocated_capacity = *psVar6;
            local_120.field_2._8_8_ = puVar3[3];
          }
          else {
            local_120.field_2._M_allocated_capacity = *psVar6;
            local_120._M_dataplus._M_p = (pointer)*puVar3;
          }
          local_120._M_string_length = puVar3[1];
          *puVar3 = psVar6;
          puVar3[1] = 0;
          *(undefined1 *)psVar6 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          __s = getenv(local_120._M_dataplus._M_p);
          if (__s == (char *)0x0) {
LAB_0011fff4:
            if ((char)local_9c != '\0') {
              local_98[0] = &local_88;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"ERROR: ","");
              plVar4 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_98,(ulong)local_120._M_dataplus._M_p);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              psVar6 = (size_type *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar6) {
                local_d8.field_2._M_allocated_capacity = *psVar6;
                local_d8.field_2._8_8_ = plVar4[3];
              }
              else {
                local_d8.field_2._M_allocated_capacity = *psVar6;
                local_d8._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_d8._M_string_length = plVar4[1];
              *plVar4 = (long)psVar6;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              puVar7 = (ulong *)(plVar4 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar4 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar7) {
                local_140.field_2._M_allocated_capacity = *puVar7;
                local_140.field_2._8_8_ = plVar4[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *puVar7;
                local_140._M_dataplus._M_p = (pointer)*plVar4;
              }
              local_140._M_string_length = plVar4[1];
              *plVar4 = (long)puVar7;
              plVar4[1] = 0;
              *(undefined1 *)(plVar4 + 2) = 0;
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,name,&local_f9)
              ;
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](local_b0,&local_50);
              std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar9 = local_88._M_allocated_capacity;
              _Var10._M_p = (pointer)local_98[0];
              if (local_98[0] != &local_88) goto LAB_0012023e;
            }
          }
          else {
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)__s);
            if (__s == (char *)0x0) goto LAB_0011fff4;
            iVar2 = std::__cxx11::string::compare((char *)&local_f8);
            if ((iVar2 == 0) ||
               (iVar2 = std::__cxx11::string::compare((char *)&local_f8), iVar2 == 0)) {
              StringPrintf_abi_cxx11_
                        (&local_140,"%sinfinite recursion on environment flag \'%s\'\n","ERROR: ",
                         local_f8._M_dataplus._M_p);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d8,name,(allocator<char> *)local_98);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](local_b0,&local_d8);
              std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_140);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                        (&local_140,local_a8,flag,local_f8._M_dataplus._M_p,local_a0);
              std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_140._M_dataplus._M_p);
            }
            uVar9 = local_140.field_2._M_allocated_capacity;
            _Var10._M_p = local_140._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
LAB_0012023e:
              operator_delete(_Var10._M_p,uVar9 + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar11 < (ulong)((long)local_78.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_78.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  return local_b8;
}

Assistant:

string CommandLineFlagParser::ProcessFromenvLocked(const string& flagval,
                                                   FlagSettingMode set_mode,
                                                   bool errors_are_fatal) {
  if (flagval.empty())
    return "";

  string msg;
  vector<string> flaglist;
  ParseFlagList(flagval.c_str(), &flaglist);

  for (size_t i = 0; i < flaglist.size(); ++i) {
    const char* flagname = flaglist[i].c_str();
    CommandLineFlag* flag = registry_->FindFlagLocked(flagname);
    if (flag == NULL) {
      error_flags_[flagname] =
          StringPrintf("%sunknown command line flag '%s' "
                       "(via --fromenv or --tryfromenv)\n",
                       kError, flagname);
      undefined_names_[flagname] = "";
      continue;
    }

    const string envname = string("FLAGS_") + string(flagname);
    string envval;
    if (!SafeGetEnv(envname.c_str(), envval)) {
      if (errors_are_fatal) {
        error_flags_[flagname] = (string(kError) + envname +
                                  " not found in environment\n");
      }
      continue;
    }

    // Avoid infinite recursion.
    if (envval == "fromenv" || envval == "tryfromenv") {
      error_flags_[flagname] =
          StringPrintf("%sinfinite recursion on environment flag '%s'\n",
                       kError, envval.c_str());
      continue;
    }

    msg += ProcessSingleOptionLocked(flag, envval.c_str(), set_mode);
  }
  return msg;
}